

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void string_suite::fail_escape_unicode_eof(void)

{
  char input [8];
  decoder_type decoder;
  undefined4 local_150;
  value local_14c;
  value_type local_148 [8];
  basic_decoder<char> local_140;
  
  builtin_memcpy(local_148,"\"\\u0000",8);
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<8ul>(&local_140,&local_148);
  local_14c = local_140.current.code;
  local_150 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x6c2,"void string_suite::fail_escape_unicode_eof()",&local_14c,&local_150);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[8]>
            ("decoder.literal()","\"\\\"\\\\u0000\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x6c3,"void string_suite::fail_escape_unicode_eof()",&local_140.current.view,
             "\"\\u0000");
  return;
}

Assistant:

void fail_escape_unicode_eof()
{
    const char input[] = "\"\\u0000";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_unexpected_token);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "\"\\u0000");
}